

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall wasm::WATParser::Lexer::skipSpace(Lexer *this)

{
  bool bVar1;
  LexAnnotationResult *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_type sVar3;
  string_view in;
  undefined1 local_70 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> ctx_1;
  undefined1 local_48 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> ctx;
  Lexer *this_local;
  
  ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
  _M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>._48_8_ =
       this;
  while( true ) {
    while( true ) {
      join_0x00000010_0x00000000_ = next(this);
      anon_unknown_0::annotation
                ((optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> *)local_48,
                 join_0x00000010_0x00000000_);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
      if (!bVar1) break;
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::
               operator->((optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> *)
                          local_48);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
      this->pos = sVar3 + this->pos;
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::
               operator->((optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> *)
                          local_48);
      std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
      push_back(&this->annotations,&pLVar2->annotation);
    }
    in = next(this);
    anon_unknown_0::space
              ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_70,in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_70);
    if (!bVar1) break;
    this_00 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_70)->
               span;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
    this->pos = sVar3 + this->pos;
  }
  return;
}

Assistant:

void Lexer::skipSpace() {
  while (true) {
    if (auto ctx = annotation(next())) {
      pos += ctx->span.size();
      annotations.push_back(ctx->annotation);
      continue;
    }
    if (auto ctx = space(next())) {
      pos += ctx->span.size();
      continue;
    }
    break;
  }
}